

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
::destroyAll(DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
             *this)

{
  bool bVar1;
  uint uVar2;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *pDVar3;
  DBKeyID *pDVar4;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *E;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *P;
  DBKeyID TombstoneKey;
  DBKeyID EmptyKey;
  DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
  *this_local;
  
  uVar2 = getNumBuckets(this);
  if (uVar2 != 0) {
    TombstoneKey = getEmptyKey();
    P = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)getTombstoneKey();
    E = getBuckets(this);
    pDVar3 = getBucketsEnd(this);
    for (; E != pDVar3; E = E + 1) {
      pDVar4 = detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getFirst(E);
      bVar1 = DenseMapInfo<DBKeyID>::isEqual(pDVar4,&TombstoneKey);
      if (!bVar1) {
        pDVar4 = detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getFirst(E);
        bVar1 = DenseMapInfo<DBKeyID>::isEqual(pDVar4,(DBKeyID *)&P);
        if (!bVar1) {
          detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getSecond(E);
        }
      }
      detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getFirst(E);
    }
  }
  return;
}

Assistant:

void destroyAll() {
    if (getNumBuckets() == 0) // Nothing to do.
      return;

    const KeyT EmptyKey = getEmptyKey(), TombstoneKey = getTombstoneKey();
    for (BucketT *P = getBuckets(), *E = getBucketsEnd(); P != E; ++P) {
      if (!KeyInfoT::isEqual(P->getFirst(), EmptyKey) &&
          !KeyInfoT::isEqual(P->getFirst(), TombstoneKey))
        P->getSecond().~ValueT();
      P->getFirst().~KeyT();
    }
  }